

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

size_t xmlBufShrink(xmlBufPtr buf,size_t len)

{
  xmlChar *__dest;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t __n;
  xmlChar *__src;
  
  if ((buf != (xmlBufPtr)0x0) && (buf->error == 0)) {
    uVar2 = (ulong)buf->compat_size;
    uVar1 = buf->size;
    if (buf->size != uVar2 && uVar2 < 0x7fffffff) {
      buf->size = uVar2;
      uVar1 = uVar2;
    }
    uVar3 = (ulong)buf->compat_use;
    uVar2 = buf->use;
    if (buf->use != uVar3 && uVar3 < 0x7fffffff) {
      buf->use = uVar3;
      uVar2 = uVar3;
    }
    if (len - 1 < uVar2) {
      __n = uVar2 - len;
      buf->use = __n;
      if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
        buf->content = buf->content + len;
        uVar1 = uVar1 - len;
        buf->size = uVar1;
      }
      else if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
              (__dest = buf->contentIO, __dest != (xmlChar *)0x0)) {
        __src = buf->content + len;
        buf->content = __src;
        uVar1 = uVar1 - len;
        buf->size = uVar1;
        if (uVar1 <= (ulong)((long)__src - (long)__dest)) {
          memmove(__dest,__src,__n);
          buf->content = buf->contentIO;
          buf->contentIO[buf->use] = '\0';
          uVar1 = ((long)__src - (long)__dest) + buf->size;
          buf->size = uVar1;
        }
      }
      else {
        memmove(buf->content,buf->content + len,__n);
        buf->content[buf->use] = '\0';
        uVar1 = buf->size;
      }
      if (0x7ffffffe < uVar1) {
        uVar1 = 0x7fffffff;
      }
      buf->compat_size = (uint)uVar1;
      uVar1 = 0x7fffffff;
      if (buf->use < 0x7fffffff) {
        uVar1 = buf->use;
      }
      buf->compat_use = (uint)uVar1;
      return len;
    }
  }
  return 0;
}

Assistant:

size_t
xmlBufShrink(xmlBufPtr buf, size_t len) {
    if ((buf == NULL) || (buf->error != 0)) return(0);
    CHECK_COMPAT(buf)
    if (len == 0) return(0);
    if (len > buf->use) return(0);

    buf->use -= len;
    if ((buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) ||
        ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != NULL))) {
	/*
	 * we just move the content pointer, but also make sure
	 * the perceived buffer size has shrunk accordingly
	 */
        buf->content += len;
	buf->size -= len;

        /*
	 * sometimes though it maybe be better to really shrink
	 * on IO buffers
	 */
	if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != NULL)) {
	    size_t start_buf = buf->content - buf->contentIO;
	    if (start_buf >= buf->size) {
		memmove(buf->contentIO, &buf->content[0], buf->use);
		buf->content = buf->contentIO;
		buf->content[buf->use] = 0;
		buf->size += start_buf;
	    }
	}
    } else {
	memmove(buf->content, &buf->content[len], buf->use);
	buf->content[buf->use] = 0;
    }
    UPDATE_COMPAT(buf)
    return(len);
}